

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-obj-list.c
# Opt level: O2

void object_list_show_interactive(wchar_t height,wchar_t width)

{
  region orig_area;
  textblock *tb;
  object_list_t *list;
  size_t max_height;
  size_t max_width;
  region_conflict r;
  size_t local_50;
  size_t local_48;
  region local_40;
  
  local_48 = 0;
  local_50 = 0;
  if (L'\0' < width && L'\0' < height) {
    tb = textblock_new();
    list = object_list_new();
    object_list_collect(list);
    object_list_sort(list,object_list_standard_compare);
    object_list_format_textblock(list,(textblock *)0x0,L'Ϩ',L'Ϩ',&local_50,&local_48);
    local_40.page_rows = height + L'\xfffffffe';
    if ((wchar_t)local_50 + L'\x02' <= height + L'\xfffffffe') {
      local_40.page_rows = (wchar_t)local_50 + L'\x02';
    }
    local_40.width = width + L'\xfffffff3';
    if ((wchar_t)local_48 <= width + L'\xfffffff3') {
      local_40.width = (wchar_t)local_48;
    }
    local_40.col = -local_40.width;
    local_40.row = L'\x01';
    object_list_format_textblock
              (list,tb,(wchar_t)local_50,local_40.width,(size_t *)0x0,(size_t *)0x0);
    region_erase_bordered(&local_40);
    orig_area.row = local_40.row;
    orig_area.col = local_40.col;
    orig_area.width = local_40.width;
    orig_area.page_rows = local_40.page_rows;
    textui_textblock_show(tb,orig_area,(char *)0x0);
    textblock_free(tb);
    object_list_free(list);
  }
  return;
}

Assistant:

void object_list_show_interactive(int height, int width)
{
	textblock *tb;
	object_list_t *list;
	size_t max_width = 0, max_height = 0;
	int safe_height, safe_width;
	region r;

	if (height < 1 || width < 1)
		return;

	tb = textblock_new();
	list = object_list_new();

	object_list_collect(list);
	object_list_sort(list, object_list_standard_compare);

	/*
	 * Figure out optimal display rect. Large numbers are passed as the height
	 * and width limit so that we can calculate the maximum number of rows and
	 * columns to display the list nicely. We then adjust those values as
	 * needed to fit in the main term. Height is adjusted to account for the
	 * texblock prompt. The list is positioned on the right side of the term
	 * underneath the status line.
	 */
	object_list_format_textblock(list, NULL, 1000, 1000, &max_height,
								 &max_width);
	safe_height = MIN(height - 2, (int)max_height + 2);
	safe_width = MIN(width - 13, (int)max_width);
	r.col = -safe_width;
	r.row = 1;
	r.width = safe_width;
	r.page_rows = safe_height;

	/*
	 * Actually draw the list. We pass in max_height to the format function so
	 * that all lines will be appended to the textblock. The textblock itself
	 * will handle fitting it into the region. However, we have to pass
	 * safe_width so that the format function will pad the lines properly so
	 * that the location string is aligned to the right edge of the list.
	 */
	object_list_format_textblock(list, tb, (int)max_height, safe_width, NULL,
								 NULL);
	region_erase_bordered(&r);
	textui_textblock_show(tb, r, NULL);

	textblock_free(tb);
	object_list_free(list);
}